

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseRefType(WastParser *this,Type *out_type)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Enum EVar2;
  char *format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  string local_118;
  Type local_f8;
  size_t local_f0;
  char *local_e8;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_e0;
  Type local_d8;
  Type type;
  Token token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string asStack_68 [32];
  iterator local_48;
  size_type local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  Type *local_20;
  Type *out_type_local;
  WastParser *this_local;
  
  local_20 = out_type;
  out_type_local = (Type *)this;
  bVar1 = PeekMatch(this,First_Type,0);
  if (bVar1) {
    Consume((Token *)&type,this);
    local_d8 = Token::type((Token *)&type);
    EVar2 = Type::operator_cast_to_Enum(&local_d8);
    if ((EVar2 == ExternRef) &&
       (bVar1 = Features::reference_types_enabled((Features *)this->options_), !bVar1)) {
      local_f8 = type;
      local_f0 = token.loc.filename._M_len;
      local_e8 = token.loc.filename._M_str;
      local_e0.offset = (size_t)token.loc.field_1.field_1.offset;
      Type::GetName_abi_cxx11_(&local_118,&local_d8);
      format = (char *)std::__cxx11::string::c_str();
      Error(this,0x35cfb5,format);
      std::__cxx11::string::~string((string *)&local_118);
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    *local_20 = local_d8;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"funcref",
               (allocator<char> *)((long)&token.field_2.literal_.text._M_str + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (asStack_68,"externref",
               (allocator<char> *)((long)&token.field_2.literal_.text._M_str + 6));
    local_48 = &local_88;
    local_40 = 2;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&token.field_2.literal_.text._M_str + 5));
    __l._M_len = local_40;
    __l._M_array = local_48;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_38,__l,(allocator_type *)((long)&token.field_2.literal_.text._M_str + 5));
    this_local._4_4_ = ErrorExpected(this,&local_38,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_38);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&token.field_2.literal_.text._M_str + 5));
    local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48;
    do {
      local_128 = local_128 + -1;
      std::__cxx11::string::~string((string *)local_128);
    } while (local_128 != &local_88);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&token.field_2.literal_.text._M_str + 6));
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&token.field_2.literal_.text._M_str + 7));
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseRefType(Type* out_type) {
  WABT_TRACE(ParseRefType);
  if (!PeekMatch(TokenType::ValueType)) {
    return ErrorExpected({"funcref", "externref"});
  }

  Token token = Consume();
  Type type = token.type();
  if (type == Type::ExternRef &&
      !options_->features.reference_types_enabled()) {
    Error(token.loc, "value type not allowed: %s", type.GetName().c_str());
    return Result::Error;
  }

  *out_type = type;
  return Result::Ok;
}